

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O0

int Sfm_NtkPerform(Sfm_Ntk_t *p,Sfm_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  int local_34;
  uint local_30;
  int nEmpty;
  int nFixed;
  int Counter;
  int k;
  int i;
  Sfm_Par_t *pPars_local;
  Sfm_Ntk_t *p_local;
  
  nEmpty = 0;
  aVar4 = Abc_Clock();
  p->timeTotal = aVar4;
  if (pPars->fVerbose != 0) {
    if (p->vFixed == (Vec_Str_t *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = Vec_StrSum(p->vFixed);
    }
    if (p->vEmpty == (Vec_Str_t *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = Vec_StrSum(p->vEmpty);
    }
    printf("Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n",
           (ulong)(uint)p->nPis,(ulong)(uint)p->nPos,(ulong)(uint)p->nNodes,
           (ulong)(p->nNodes - local_30),(ulong)local_30,local_34);
  }
  p->pPars = pPars;
  Sfm_NtkPrepare(p);
  iVar1 = Sfm_NtkPiNum(p);
  iVar2 = Vec_WecSize(&p->vFanins);
  iVar3 = Sfm_NtkPoNum(p);
  iVar1 = Vec_WecSizeUsedLimits(&p->vFanins,iVar1,iVar2 - iVar3);
  p->nTotalNodesBeg = iVar1;
  iVar1 = Vec_WecSizeSize(&p->vFanins);
  iVar2 = Sfm_NtkPoNum(p);
  p->nTotalEdgesBeg = iVar1 - iVar2;
  for (Counter = p->nPis; Counter + p->nPos < p->nObjs; Counter = Counter + 1) {
    iVar1 = Sfm_ObjIsFixed(p,Counter);
    if (((iVar1 == 0) &&
        (((p->pPars->nDepthMax == 0 ||
          (iVar1 = Sfm_ObjLevel(p,Counter), iVar1 <= p->pPars->nDepthMax)) &&
         (iVar1 = Sfm_ObjFaninNum(p,Counter), 1 < iVar1)))) &&
       (iVar1 = Sfm_ObjFaninNum(p,Counter), iVar1 < 7)) {
      nFixed = 0;
      while (iVar1 = Sfm_NodeResub(p,Counter), iVar1 != 0) {
        nFixed = nFixed + 1;
      }
      nEmpty = (uint)(0 < nFixed) + nEmpty;
      if ((pPars->nNodesMax != 0) && (pPars->nNodesMax <= nEmpty)) break;
    }
  }
  iVar1 = Sfm_NtkPiNum(p);
  iVar2 = Vec_WecSize(&p->vFanins);
  iVar3 = Sfm_NtkPoNum(p);
  iVar1 = Vec_WecSizeUsedLimits(&p->vFanins,iVar1,iVar2 - iVar3);
  p->nTotalNodesEnd = iVar1;
  iVar1 = Vec_WecSizeSize(&p->vFanins);
  iVar2 = Sfm_NtkPoNum(p);
  p->nTotalEdgesEnd = iVar1 - iVar2;
  aVar4 = Abc_Clock();
  p->timeTotal = aVar4 - p->timeTotal;
  if (pPars->fVerbose != 0) {
    Sfm_NtkPrintStats(p);
  }
  return nEmpty;
}

Assistant:

int Sfm_NtkPerform( Sfm_Ntk_t * p, Sfm_Par_t * pPars )
{
    int i, k, Counter = 0;
    //Sfm_NtkPrint( p );
    p->timeTotal = Abc_Clock();
    if ( pPars->fVerbose )
    {
        int nFixed = p->vFixed ? Vec_StrSum(p->vFixed) : 0;
        int nEmpty = p->vEmpty ? Vec_StrSum(p->vEmpty) : 0;
        printf( "Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n", 
            p->nPis, p->nPos, p->nNodes, p->nNodes-nFixed, nFixed, nEmpty );
    }
    p->pPars = pPars;
    Sfm_NtkPrepare( p );
//    Sfm_ComputeInterpolantCheck( p );
//    return 0;
    p->nTotalNodesBeg = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesBeg = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    Sfm_NtkForEachNode( p, i )
    {
        if ( Sfm_ObjIsFixed( p, i ) )
            continue;
        if ( p->pPars->nDepthMax && Sfm_ObjLevel(p, i) > p->pPars->nDepthMax )
            continue;
        if ( Sfm_ObjFaninNum(p, i) < 2 || Sfm_ObjFaninNum(p, i) > 6 )
            continue;
        for ( k = 0; Sfm_NodeResub(p, i); k++ )
        {
//            Counter++;
//            break;
        }
        Counter += (k > 0);
        if ( pPars->nNodesMax && Counter >= pPars->nNodesMax )
            break;
    }
    p->nTotalNodesEnd = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesEnd = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
        Sfm_NtkPrintStats( p );
    //Sfm_NtkPrint( p );
    return Counter;
}